

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  size_t in_R8;
  string_view message;
  memory_buffer outbuf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_230;
  
  *(undefined ***)this = &PTR__spdlog_ex_00124d88;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  (this->msg_)._M_string_length = 0;
  (this->msg_).field_2._M_local_buf[0] = '\0';
  local_230.super_basic_buffer<char>.ptr_ = local_230.store_;
  local_230.super_basic_buffer<char>.size_ = 0;
  local_230.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00123e00;
  local_230.super_basic_buffer<char>.capacity_ = 500;
  message.size_ = in_R8;
  message.data_ = (char *)msg->_M_string_length;
  fmt::v5::format_system_error
            ((v5 *)&local_230,(buffer *)(ulong)(uint)last_errno,(int)(msg->_M_dataplus)._M_p,message
            );
  fmt::v5::to_string<char,500ul>(&local_250,(v5 *)&local_230,buf);
  std::__cxx11::string::operator=((string *)&this->msg_,(string *)&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_230)
  ;
  return;
}

Assistant:

spdlog_ex(const std::string &msg, int last_errno)
    {
        fmt::memory_buffer outbuf;
        fmt::format_system_error(outbuf, last_errno, msg);
        msg_ = fmt::to_string(outbuf);
    }